

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

OpenFileInfo * __thiscall
duckdb::GlobMultiFileList::GetFileInternal
          (OpenFileInfo *__return_storage_ptr__,GlobMultiFileList *this,idx_t i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  ulong uVar5;
  reference pvVar6;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  while (uVar5 = ((long)(this->expanded_files).
                        super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->expanded_files).
                        super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                        super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
        uVar5 < i || uVar5 - i == 0) {
    bVar4 = ExpandPathInternal(this,&this->current_path,&this->expanded_files);
    if (!bVar4) {
      local_50 = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,anon_var_dwarf_643533f + 9);
      paVar1 = &(__return_storage_ptr__->path).field_2;
      (__return_storage_ptr__->path)._M_dataplus._M_p = (pointer)paVar1;
      if (local_50 == &local_40) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)((long)&(__return_storage_ptr__->path).field_2 + 8) = uStack_38;
      }
      else {
        (__return_storage_ptr__->path)._M_dataplus._M_p = local_50;
        (__return_storage_ptr__->path).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      }
      (__return_storage_ptr__->path)._M_string_length = local_48;
      (__return_storage_ptr__->extended_info).internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->extended_info).internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      return __return_storage_ptr__;
    }
  }
  pvVar6 = vector<duckdb::OpenFileInfo,_true>::operator[](&this->expanded_files,i);
  (__return_storage_ptr__->path)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->path).field_2
  ;
  pcVar2 = (pvVar6->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pvVar6->path)._M_string_length);
  (__return_storage_ptr__->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pvVar6->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (pvVar6->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (__return_storage_ptr__->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return __return_storage_ptr__;
  }
  if (__libc_single_threaded != '\0') {
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    return __return_storage_ptr__;
  }
  LOCK();
  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

OpenFileInfo GlobMultiFileList::GetFileInternal(idx_t i) {
	while (expanded_files.size() <= i) {
		if (!ExpandNextPath()) {
			return OpenFileInfo("");
		}
	}
	D_ASSERT(expanded_files.size() > i);
	return expanded_files[i];
}